

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_int128_tests(void)

{
  uint64_t uVar1;
  int64_t iVar2;
  int i;
  secp256k1_int128 res_1;
  secp256k1_uint128 res;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  int64_t in_stack_ffffffffffffffe0;
  int64_t in_stack_ffffffffffffffe8;
  secp256k1_int128 *in_stack_fffffffffffffff0;
  
  secp256k1_u128_mul((secp256k1_uint128 *)&stack0xffffffffffffffe8,0xffffffffffffffff,
                     0xffffffffffffffff);
  secp256k1_u128_accum_mul
            ((secp256k1_uint128 *)&stack0xffffffffffffffe8,0xffffffffffffffff,0xffffffffffffffff);
  uVar1 = secp256k1_u128_to_u64((secp256k1_uint128 *)&stack0xffffffffffffffe8);
  if (uVar1 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x864,"test condition failed: secp256k1_u128_to_u64(&res) == 2");
    abort();
  }
  uVar1 = secp256k1_u128_hi_u64((secp256k1_uint128 *)&stack0xffffffffffffffe8);
  if (uVar1 != 0xfffffffffffffffc) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x865,"test condition failed: secp256k1_u128_hi_u64(&res) == 18446744073709551612U");
    abort();
  }
  secp256k1_i128_mul((secp256k1_int128 *)&stack0xffffffffffffffd8,0x7fffffffffffffff,
                     0x7fffffffffffffff);
  secp256k1_i128_accum_mul
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  uVar1 = secp256k1_i128_to_u64((secp256k1_int128 *)&stack0xffffffffffffffd8);
  if (uVar1 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x86d,"test condition failed: secp256k1_i128_to_u64(&res) == 2");
    abort();
  }
  secp256k1_i128_accum_mul
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  secp256k1_i128_accum_mul
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  uVar1 = secp256k1_i128_to_u64((secp256k1_int128 *)&stack0xffffffffffffffd8);
  if (uVar1 != 0xffffffffffffffff) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x870,"test condition failed: secp256k1_i128_to_u64(&res) == UINT64_MAX");
    abort();
  }
  secp256k1_i128_rshift
            ((secp256k1_int128 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffcc);
  iVar2 = secp256k1_i128_to_i64
                    ((secp256k1_int128 *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (iVar2 != 0x7fffffffffffffff) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x872,"test condition failed: secp256k1_i128_to_i64(&res) == INT64_MAX");
    abort();
  }
  secp256k1_i128_mul((secp256k1_int128 *)&stack0xffffffffffffffd8,0x7fffffffffffffff,
                     -0x8000000000000000);
  uVar1 = secp256k1_i128_to_u64((secp256k1_int128 *)&stack0xffffffffffffffd8);
  if (uVar1 != 0x8000000000000000) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x876,"test condition failed: secp256k1_i128_to_u64(&res) == (uint64_t)INT64_MIN");
    abort();
  }
  secp256k1_i128_accum_mul
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  uVar1 = secp256k1_i128_to_u64((secp256k1_int128 *)&stack0xffffffffffffffd8);
  if (uVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x878,"test condition failed: secp256k1_i128_to_u64(&res) == 0");
    abort();
  }
  secp256k1_i128_accum_mul
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  uVar1 = secp256k1_i128_to_u64((secp256k1_int128 *)&stack0xffffffffffffffd8);
  if (uVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x87a,"test condition failed: secp256k1_i128_to_u64(&res) == 0");
    abort();
  }
  secp256k1_i128_rshift
            ((secp256k1_int128 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffcc);
  iVar2 = secp256k1_i128_to_i64
                    ((secp256k1_int128 *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (iVar2 != -0x8000000000000000) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x87c,"test condition failed: secp256k1_i128_to_i64(&res) == INT64_MIN");
    abort();
  }
  for (iVar3 = 0; iVar3 < COUNT * 0x100; iVar3 = iVar3 + 1) {
    run_int128_test_case();
  }
  return;
}

Assistant:

static void run_int128_tests(void) {
    {   /* secp256k1_u128_accum_mul */
        secp256k1_uint128 res;

        /* Check secp256k1_u128_accum_mul overflow */
        secp256k1_u128_mul(&res, UINT64_MAX, UINT64_MAX);
        secp256k1_u128_accum_mul(&res, UINT64_MAX, UINT64_MAX);
        CHECK(secp256k1_u128_to_u64(&res) == 2);
        CHECK(secp256k1_u128_hi_u64(&res) == 18446744073709551612U);
    }
    {   /* secp256k1_u128_accum_mul */
        secp256k1_int128 res;

        /* Compute INT128_MAX = 2^127 - 1 with secp256k1_i128_accum_mul */
        secp256k1_i128_mul(&res, INT64_MAX, INT64_MAX);
        secp256k1_i128_accum_mul(&res, INT64_MAX, INT64_MAX);
        CHECK(secp256k1_i128_to_u64(&res) == 2);
        secp256k1_i128_accum_mul(&res, 4, 9223372036854775807);
        secp256k1_i128_accum_mul(&res, 1, 1);
        CHECK(secp256k1_i128_to_u64(&res) == UINT64_MAX);
        secp256k1_i128_rshift(&res, 64);
        CHECK(secp256k1_i128_to_i64(&res) == INT64_MAX);

        /* Compute INT128_MIN = - 2^127 with secp256k1_i128_accum_mul */
        secp256k1_i128_mul(&res, INT64_MAX, INT64_MIN);
        CHECK(secp256k1_i128_to_u64(&res) == (uint64_t)INT64_MIN);
        secp256k1_i128_accum_mul(&res, INT64_MAX, INT64_MIN);
        CHECK(secp256k1_i128_to_u64(&res) == 0);
        secp256k1_i128_accum_mul(&res, 2, INT64_MIN);
        CHECK(secp256k1_i128_to_u64(&res) == 0);
        secp256k1_i128_rshift(&res, 64);
        CHECK(secp256k1_i128_to_i64(&res) == INT64_MIN);
    }
    {
        /* Randomized tests. */
        int i;
        for (i = 0; i < 256 * COUNT; ++i) run_int128_test_case();
    }
}